

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_containers_bitset.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
  color_bitset;
  
  color_bitset.a._M_elems[0] = (container_type)(_Type)0x0;
  magic_enum::containers::
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::set
            (&color_bitset,GREEN,true);
  magic_enum::containers::
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::set
            (&color_bitset,BLUE,true);
  *(uint *)(std::ostream::_M_insert<bool> + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ostream::_M_insert<bool> + *(long *)(std::cout + -0x18)) | 1;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::endl<char,std::char_traits<char>>(poVar1);
  magic_enum::containers::
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::count
            (&color_bitset);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  magic_enum::containers::
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::test
            (&color_bitset,RED);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::endl<char,std::char_traits<char>>(poVar1);
  magic_enum::containers::
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::test
            (&color_bitset,GREEN);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::endl<char,std::char_traits<char>>(poVar1);
  magic_enum::containers::
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::test
            (&color_bitset,BLUE);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main() {

  auto color_bitset = magic_enum::containers::bitset<Color>();
  color_bitset.set(Color::GREEN);
  color_bitset.set(Color::BLUE);

  std::cout << std::boolalpha;
  std::cout << color_bitset.size() << std::endl; // 3 == magic_enum::enum_count<Color>()
  std::cout << color_bitset.all() << std::endl; // false
  std::cout << color_bitset.any() << std::endl; // true
  std::cout << color_bitset.none() << std::endl; // false
  std::cout << color_bitset.count() << std::endl; // 2
  std::cout << color_bitset.test(Color::RED) << std::endl; // false
  std::cout << color_bitset.test(Color::GREEN) << std::endl; // true
  std::cout << color_bitset.test(Color::BLUE) << std::endl; // true

  return 0;
}